

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

size_t anon_unknown.dwarf_2fa26a::cmWriteToMemoryCallback
                 (void *ptr,size_t size,size_t nmemb,void *data)

{
  size_t sVar1;
  
  sVar1 = (size_t)((int)size * (int)nmemb);
  cmAppend<char,char_const*>
            ((vector<char,_std::allocator<char>_> *)data,(char *)ptr,(char *)((long)ptr + sVar1));
  return sVar1;
}

Assistant:

size_t cmWriteToMemoryCallback(void* ptr, size_t size, size_t nmemb,
                               void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  const char* chPtr = static_cast<char*>(ptr);
  cmAppend(*static_cast<cmFileCommandVectorOfChar*>(data), chPtr,
           chPtr + realsize);
  return realsize;
}